

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgVector.h
# Opt level: O2

void __thiscall dgVector::dgVector(dgVector *this,dgTemplateVector<float> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = v->m_y;
  fVar2 = v->m_z;
  fVar3 = v->m_w;
  (this->super_dgTemplateVector<float>).m_x = v->m_x;
  (this->super_dgTemplateVector<float>).m_y = fVar1;
  (this->super_dgTemplateVector<float>).m_z = fVar2;
  (this->super_dgTemplateVector<float>).m_w = fVar3;
  if (((((uint)ABS((this->super_dgTemplateVector<float>).m_x) < 0x7f800000) &&
       ((uint)ABS((this->super_dgTemplateVector<float>).m_y) < 0x7f800000)) &&
      ((uint)ABS((this->super_dgTemplateVector<float>).m_z) < 0x7f800000)) &&
     ((uint)ABS((this->super_dgTemplateVector<float>).m_w) < 0x7f800000)) {
    return;
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
}

Assistant:

HACD_INLINE dgVector::dgVector (const dgTemplateVector<hacd::HaF32>& v)
	:dgTemplateVector<hacd::HaF32>(v)
{
	HACD_ASSERT (dgCheckVector ((*this)));
}